

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

void __thiscall
gl4cts::TextureViewTestCoherency::checkAPICallCoherency
          (TextureViewTestCoherency *this,_texture_type texture_type,bool should_use_glTexSubImage2D
          )

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  uchar *puVar4;
  int *piVar5;
  TestError *this_00;
  undefined7 in_register_00000011;
  char *msg;
  uint width;
  uint height;
  int iVar6;
  GLuint write_to_id;
  int local_48;
  _texture_type local_44;
  uint write_to_width;
  uint write_to_height;
  GLuint read_to_id;
  uint read_lod;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  write_to_height = 0;
  write_to_width = 0;
  write_to_id = 0;
  local_44 = texture_type;
  getWritePropertiesForTextureType(this,texture_type,&write_to_id,&write_to_width,&write_to_height);
  local_48 = (int)CONCAT71(in_register_00000011,should_use_glTexSubImage2D);
  if (local_48 == 0) {
    (**(code **)(lVar3 + 0x78))(0x8ca9,this->m_draw_fbo_id);
    (**(code **)(lVar3 + 0x78))(0x8ca8,this->m_read_fbo_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glBindFramebuffer call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1f94);
    (**(code **)(lVar3 + 0x6a0))(0x8ca9,0x8ce0,0xde1,write_to_id,1);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glFramebufferTexture2D() call failed for GL_DRAW_FRAMEBUFFER target.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1f97);
    (**(code **)(lVar3 + 0x6a0))(0x8ca8,0x8ce0,0xde1,this->m_static_to_id,0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    msg = "glFramebufferTexture2D() call failed for GL_READ_FRAMEBUFFER target.";
    iVar1 = 0x1f9b;
  }
  else {
    (**(code **)(lVar3 + 8))(0x84c0);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glActiveTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1f89);
    (**(code **)(lVar3 + 0xb8))(0xde1,write_to_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    msg = "glBindTexture() call failed.";
    iVar1 = 0x1f8c;
  }
  glu::checkError(dVar2,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,iVar1);
  width = write_to_width >> 1;
  height = write_to_height >> 1;
  iVar1 = width - (write_to_width >> 2);
  iVar6 = height - (write_to_height >> 2);
  if ((char)local_48 == '\0') {
    (**(code **)(lVar3 + 0x140))
              (0,0,this->m_static_texture_width,this->m_static_texture_height,iVar1,iVar6,
               width + iVar1,height + iVar6,0x4000,0x2600);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glBlitFramebuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1fbf);
  }
  else {
    puVar4 = getStaticColorTextureData(this,width,height);
    (**(code **)(lVar3 + 0x13b8))(0xde1,1,iVar1,iVar6,width,height,0x1908,0x1401,puVar4);
    operator_delete__(puVar4);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glTexSubImage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1fb4);
  }
  read_lod = 0;
  read_to_id = 0;
  getReadPropertiesForTextureType(this,local_44,&read_to_id,&read_lod);
  (**(code **)(lVar3 + 0xb8))(0xde1,read_to_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1fce);
  (**(code **)(lVar3 + 0x1680))(this->m_verification_po_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1fd4);
  (**(code **)(lVar3 + 0x15a8))
            (this->m_verification_po_expected_color_location,1,this->m_static_color_float);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glUniform4fv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1fda);
  (**(code **)(lVar3 + 0x14f0))(this->m_verification_po_lod_location,read_lod);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glUniform1i() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1fdd);
  (**(code **)(lVar3 + 0x5e0))(0x8c89);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glEnable() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1fe1);
  (**(code **)(lVar3 + 0x30))(0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glBeginTransformFeedback() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1fe5);
  (**(code **)(lVar3 + 0x538))(0,0,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glDrawArrays() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1fe8);
  (**(code **)(lVar3 + 0x638))();
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glEndTransformFeedback() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1feb);
  piVar5 = (int *)(**(code **)(lVar3 + 0xcf8))(0x8c8e,35000);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glMapBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1ff0);
  if (*piVar5 == 1) {
    (**(code **)(lVar3 + 0x1670))(0x8c8e);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glUnmapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1ffb);
    (**(code **)(lVar3 + 0x4e8))(0x8c89);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"glDisable() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x2001);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid data was sampled in vertex shader",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
             ,0x1ff6);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureViewTestCoherency::checkAPICallCoherency(_texture_type texture_type, bool should_use_glTexSubImage2D)
{
	const glw::Functions& gl			  = m_context.getRenderContext().getFunctions();
	unsigned int		  write_to_height = 0;
	unsigned int		  write_to_width  = 0;
	glw::GLuint			  write_to_id	 = 0;

	getWritePropertiesForTextureType(texture_type, &write_to_id, &write_to_width, &write_to_height);

	if (should_use_glTexSubImage2D)
	{
		/* Update texture binding for texture unit 0, given the texture type the caller wants
		 * us to test. We'll need the binding set appropriately for the subsequent
		 * glTexSubImage2D() call.
		 */
		gl.activeTexture(GL_TEXTURE0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glActiveTexture() call failed.");

		gl.bindTexture(GL_TEXTURE_2D, write_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");
	}
	else
	{
		/* To perform a blit operation, we need to configure draw & read FBO, taking
		 * the tested texture type into account. */
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_draw_fbo_id);
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_read_fbo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer call(s) failed.");

		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, write_to_id, 1); /* level */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed for GL_DRAW_FRAMEBUFFER target.");

		gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_static_to_id,
								0); /* level */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed for GL_READ_FRAMEBUFFER target.");
	}

	/* Execute the API call */
	const unsigned int region_width  = (write_to_width >> 1);
	const unsigned int region_height = (write_to_height >> 1);
	const unsigned int region_x		 = region_width - (region_width >> 1);
	const unsigned int region_y		 = region_height - (region_height >> 1);

	if (should_use_glTexSubImage2D)
	{
		/* Call glTexSubImage2D() to replace a portion of the gradient with a static color */
		{
			unsigned char* static_color_data_ptr = getStaticColorTextureData(region_width, region_height);

			gl.texSubImage2D(GL_TEXTURE_2D, 1, /* level */
							 region_x, region_y, region_width, region_height, GL_RGBA, GL_UNSIGNED_BYTE,
							 static_color_data_ptr);

			/* Good to release static color data buffer at this point */
			delete[] static_color_data_ptr;

			static_color_data_ptr = DE_NULL;

			/* Make sure the API call was successful */
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexSubImage2D() call failed.");
		}
	}
	else
	{
		gl.blitFramebuffer(0,						/* srcX0 */
						   0,						/* srcY0 */
						   m_static_texture_width,  /* srcX1 */
						   m_static_texture_height, /* srcY1 */
						   region_x, region_y, region_x + region_width, region_y + region_height, GL_COLOR_BUFFER_BIT,
						   GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBlitFramebuffer() call failed.");
	}

	/* Bind the sibling object so that we can make sure the data read from the
	 * region can be correctly read from a shader without a memory barrier.
	 *
	 * While we're here, also determine which LOD we should be sampling from in
	 * the shader.
	 **/
	unsigned int read_lod   = 0;
	glw::GLuint  read_to_id = 0;

	getReadPropertiesForTextureType(texture_type, &read_to_id, &read_lod);

	gl.bindTexture(GL_TEXTURE_2D, read_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	/* Update the test program uniforms before we carry on with actual
	 * verification
	 */
	gl.useProgram(m_verification_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	DE_STATIC_ASSERT(sizeof(m_static_color_float) == sizeof(float) * 4);

	gl.uniform4fv(m_verification_po_expected_color_location, 1, /* count */
				  m_static_color_float);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform4fv() call failed.");

	gl.uniform1i(m_verification_po_lod_location, read_lod);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call failed.");

	/* Make sure rasterization is disabled before we carry on */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable() call failed.");

	/* Go ahead with the rendering. Make sure to capture the varyings */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
	{
		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");

	/* Map the buffer object so we can validate the sampling result */
	const glw::GLint* data_ptr = (const glw::GLint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");
	DE_ASSERT(data_ptr != NULL);

	/* Verify the outcome of the sampling operation */
	if (*data_ptr != 1)
	{
		TCU_FAIL("Invalid data was sampled in vertex shader");
	}

	/* Unmap the buffer object */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

	data_ptr = DE_NULL;

	/* Disable GL_RASTERIZER_DISCARD mode */
	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable() call failed.");
}